

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O2

void t2_hints_stems(T2_Hints hints,FT_UInt dimension,FT_Int count,FT_Fixed *coords)

{
  FT_Fixed FVar1;
  ulong uVar2;
  FT_Pos y;
  long a;
  uint count_00;
  uint uVar3;
  FT_Pos stems [32];
  
  a = 0;
  for (; 0 < count; count = count - count_00) {
    count_00 = 0x10;
    if ((uint)count < 0x10) {
      count_00 = count;
    }
    uVar3 = count;
    if (0xf < (uint)count) {
      uVar3 = 0x10;
    }
    for (uVar2 = 0; uVar3 << 4 != uVar2; uVar2 = uVar2 + 8) {
      a = a + *(long *)((long)coords + uVar2);
      FVar1 = FT_RoundFix(a);
      *(FT_Fixed *)((long)stems + uVar2) = FVar1 >> 0x10;
    }
    for (uVar2 = 0; uVar2 < count_00 * 2; uVar2 = uVar2 + 2) {
      stems[uVar2 + 1] = stems[uVar2 + 1] - stems[uVar2];
    }
    ps_hints_stem((PS_Hints)hints,dimension,count_00,stems);
  }
  return;
}

Assistant:

static void
  t2_hints_stems( T2_Hints   hints,
                  FT_UInt    dimension,
                  FT_Int     count,
                  FT_Fixed*  coords )
  {
    FT_Pos  stems[32], y;
    FT_Int  total = count, n;


    y = 0;
    while ( total > 0 )
    {
      /* determine number of stems to write */
      count = total;
      if ( count > 16 )
        count = 16;

      /* compute integer stem positions in font units */
      for ( n = 0; n < count * 2; n++ )
      {
        y        = ADD_LONG( y, coords[n] );
        stems[n] = FIXED_TO_INT( y );
      }

      /* compute lengths */
      for ( n = 0; n < count * 2; n += 2 )
        stems[n + 1] = stems[n + 1] - stems[n];

      /* add them to the current dimension */
      ps_hints_stem( (PS_Hints)hints, dimension, count, stems );

      total -= count;
    }
  }